

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O1

void spell_corpse_trap(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  byte *pbVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  OBJ_DATA *obj;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj_00;
  char *pcVar8;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar4 = is_affected(ch,sn);
  if (bVar4) {
    pcVar8 = "You are not ready to make another trap yet.\n\r";
  }
  else {
    obj = get_obj_here(ch,target_name);
    if (obj != (OBJ_DATA *)0x0) {
      bVar4 = str_cmp(target_name,"");
      if (bVar4) {
        sVar2 = (short)*(undefined4 *)&obj->item_type;
        if ((ushort)(sVar2 - 0x17U) < 2) {
          if (obj->level + 6 < (int)ch->level) {
            pcVar8 = "That corpse is not powerful enough.\n\r";
          }
          else {
            if ((sVar2 == 0x17) || (obj->contains == (OBJ_DATA *)0x0)) {
              iVar5 = get_skill(ch,sn);
              sVar2 = ch->level;
              sVar3 = obj->level;
              iVar6 = get_curr_stat(ch,1);
              iVar7 = number_percent();
              if (iVar6 + (((int)sVar2 + iVar5 / 2) - (int)sVar3) < iVar7) {
                send_to_char("Your magic accelerates the decaying process too quickly, destroying the corpse.\n\r"
                             ,ch);
                act("$p decays rapidly, leaving nothing but dust.",ch,obj,(void *)0x0,0);
                extract_obj(obj);
                return;
              }
              pObjIndex = get_obj_index(0);
              obj_00 = create_object(pObjIndex,(int)obj->level);
              obj_00->level = ch->level;
              iVar5 = number_range(5,8);
              obj_00->timer = (short)iVar5;
              if (obj->item_type == 0x17) {
                obj_00->item_type = 0x17;
              }
              pbVar1 = (byte *)((long)obj_00->extra_flags + 3);
              *pbVar1 = *pbVar1 | 8;
              act("You carefully accelerate the decay rate of $p, preparing it to explode.",ch,obj,
                  (void *)0x0,3);
              act("$p\'s skin begins to wrinkle and fold.",ch,obj,(void *)0x0,0);
              extract_obj(obj);
              obj_to_room(obj_00,ch->in_room);
              pcVar8 = palloc_string(ch->true_name);
              obj_00->owner = pcVar8;
              init_affect(&local_90);
              local_90.where = 0;
              local_90.aftype = 7;
              local_90.modifier = 0;
              local_90.duration = 0x18;
              local_90.location = 0;
              local_90.level = ch->level;
              local_90.type = (short)sn;
              affect_to_char(ch,&local_90);
              return;
            }
            pcVar8 = "You can\'t trap a corpse with things in it!\n\r";
          }
        }
        else {
          pcVar8 = "That\'s not a suitable corpse.\n\r";
        }
        goto LAB_0030a682;
      }
    }
    pcVar8 = "You don\'t see that here.\n\r";
  }
LAB_0030a682:
  send_to_char(pcVar8,ch);
  return;
}

Assistant:

void spell_corpse_trap(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *corpse;
	OBJ_DATA *trap;
	AFFECT_DATA af;
	int chance;
	int vnum = 2926;

	if (is_affected(ch, sn))
	{
		send_to_char("You are not ready to make another trap yet.\n\r", ch);
		return;
	}

	corpse = get_obj_here(ch, target_name);

	if (!corpse || !str_cmp(target_name, ""))
	{
		send_to_char("You don't see that here.\n\r", ch);
		return;
	}

	if (corpse->item_type != ITEM_CORPSE_NPC && corpse->item_type != ITEM_CORPSE_PC)
	{
		send_to_char("That's not a suitable corpse.\n\r", ch);
		return;
	}

	if ((corpse->level + 6) < ch->level)
	{
		send_to_char("That corpse is not powerful enough.\n\r", ch);
		return;
	}

	if (corpse->item_type != ITEM_CORPSE_NPC && corpse->contains != nullptr)
	{
		send_to_char("You can't trap a corpse with things in it!\n\r", ch);
		return;
	}

	chance = get_skill(ch, sn) / 2;
	chance += ch->level - corpse->level;
	chance += get_curr_stat(ch, STAT_INT);

	if (number_percent() > chance)
	{
		send_to_char("Your magic accelerates the decaying process too quickly, destroying the corpse.\n\r", ch);
		act("$p decays rapidly, leaving nothing but dust.", ch, corpse, 0, TO_ROOM);

		extract_obj(corpse);
		return;
	}

	trap = create_object(get_obj_index(vnum), corpse->level);
	trap->level = ch->level;
	trap->timer = number_range(5, 8);

	if (corpse->item_type == ITEM_CORPSE_NPC)
		trap->item_type = ITEM_CORPSE_NPC;

	SET_BIT(trap->extra_flags, CORPSE_NO_ANIMATE);

	act("You carefully accelerate the decay rate of $p, preparing it to explode.", ch, corpse, 0, TO_CHAR);
	act("$p's skin begins to wrinkle and fold.", ch, corpse, 0, TO_ROOM);

	extract_obj(corpse);
	obj_to_room(trap, ch->in_room);

	trap->owner = palloc_string(ch->true_name);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = sn;
	af.location = 0;
	af.modifier = 0;
	af.duration = 24;
	af.level = ch->level;
	affect_to_char(ch, &af);
}